

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O0

string * __thiscall
Catch::StringMaker<signed_char,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<signed_char,void> *this,char value)

{
  allocator local_31;
  char local_30;
  char cStack_2f;
  undefined2 uStack_2e;
  uint local_2c;
  char chstr [4];
  allocator local_12;
  char local_11;
  string *psStack_10;
  char value_local;
  
  local_11 = (char)this;
  psStack_10 = __return_storage_ptr__;
  if (local_11 == '\r') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\'\\r\'",&local_12);
    std::allocator<char>::~allocator((allocator<char> *)&local_12);
  }
  else if (local_11 == '\f') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"\'\\f\'",(allocator *)(chstr + 3));
    std::allocator<char>::~allocator((allocator<char> *)(chstr + 3));
  }
  else if (local_11 == '\n') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"\'\\n\'",(allocator *)(chstr + 2));
    std::allocator<char>::~allocator((allocator<char> *)(chstr + 2));
  }
  else if (local_11 == '\t') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"\'\\t\'",(allocator *)(chstr + 1));
    std::allocator<char>::~allocator((allocator<char> *)(chstr + 1));
  }
  else if ((local_11 < '\0') || ('\x1f' < local_11)) {
    _local_30 = CONCAT22(0x27,CONCAT11(local_11,0x27));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,&local_30,&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else {
    local_2c = (uint)local_11;
    Detail::stringify<unsigned_int>(__return_storage_ptr__,&local_2c);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<signed char>::convert(signed char value) {
    if (value == '\r') {
        return "'\\r'";
    } else if (value == '\f') {
        return "'\\f'";
    } else if (value == '\n') {
        return "'\\n'";
    } else if (value == '\t') {
        return "'\\t'";
    } else if ('\0' <= value && value < ' ') {
        return ::Catch::Detail::stringify(static_cast<unsigned int>(value));
    } else {
        char chstr[] = "' '";
        chstr[1] = value;
        return chstr;
    }
}